

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O1

idx_t __thiscall duckdb::StructColumnReader::GroupRowsAvailable(StructColumnReader *this)

{
  vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
  *this_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pCVar4;
  pointer puVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer __n;
  bool bVar6;
  
  this_00 = &this->child_readers;
  puVar5 = (this->child_readers).
           super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = puVar5 != (this->child_readers).
                    super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (bVar6) {
    __n = (pointer)0x0;
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::operator[](this_00,0);
    pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
             operator->(pvVar3);
    bVar1 = TypeHasExactRowCount(&pCVar4->column_schema->type);
    if (!bVar1) {
      __n = (pointer)0x0;
      do {
        __n = (pointer)((long)&(__n->
                               super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                               )._M_t.
                               super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
                               .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl +
                       1);
        puVar5 = (pointer)((long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
        bVar6 = __n < puVar5;
        if (!bVar6) goto LAB_0033af74;
        pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                 ::operator[](this_00,(size_type)__n);
        pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                 operator->(pvVar3);
        bVar1 = TypeHasExactRowCount(&pCVar4->column_schema->type);
      } while (!bVar1);
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
             ::operator[](this_00,(size_type)__n);
    pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
             operator->(pvVar3);
    iVar2 = (*pCVar4->_vptr_ColumnReader[9])(pCVar4);
    puVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  }
LAB_0033af74:
  if (bVar6) {
    return (idx_t)puVar5;
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
           ::operator[](this_00,0);
  pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(pvVar3);
  iVar2 = (*pCVar4->_vptr_ColumnReader[9])(pCVar4);
  return CONCAT44(extraout_var_00,iVar2);
}

Assistant:

idx_t StructColumnReader::GroupRowsAvailable() {
	for (idx_t i = 0; i < child_readers.size(); i++) {
		if (TypeHasExactRowCount(child_readers[i]->Type())) {
			return child_readers[i]->GroupRowsAvailable();
		}
	}
	return child_readers[0]->GroupRowsAvailable();
}